

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O2

void loadKernel(void)

{
  VMContext *pVVar1;
  allocator local_31;
  string local_30 [32];
  
  pVVar1 = context;
  std::__cxx11::string::string(local_30,"runtime/runtime.lodtalk",&local_31);
  Lodtalk::VMContext::executeScriptFromFileNamed((string *)pVVar1);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void loadKernel()
{
    context->executeScriptFromFileNamed("runtime/runtime.lodtalk");
}